

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

bool __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::SizeAtCapacity(RepeatedPtrFieldBase *this)

{
  string sVar1;
  anon_class_40_5_beb31822 add;
  anon_class_40_5_beb31822 add_00;
  anon_class_40_5_beb31822 add_01;
  bool bVar2;
  char cVar3;
  int iVar4;
  Rep *pRVar5;
  string *extraout_RAX;
  char *pcVar6;
  string *psVar7;
  string *extraout_RAX_00;
  unsigned_long extraout_RDX;
  unsigned_long extraout_RDX_00;
  unsigned_long extraout_RDX_01;
  unsigned_long uVar8;
  code *unaff_RBX;
  uint uVar9;
  long lVar10;
  EpsCopyInputStream *this_00;
  UnknownFieldSet *this_01;
  string *unaff_R12;
  int iVar11;
  uint uVar12;
  undefined8 unaff_R14;
  string *psVar13;
  ulong uVar14;
  pair<const_char_*,_int> pVar15;
  pair<const_char_*,_unsigned_long> pVar16;
  InternalMetadata *unaff_retaddr;
  RepeatedField<int> *this_02;
  code *pcVar17;
  undefined8 uVar18;
  InternalMetadata *this_03;
  char *pcStack_80;
  undefined2 uStack_78;
  undefined6 uStack_76;
  undefined2 uStack_70;
  undefined8 uStack_6e;
  RepeatedPtrFieldBase *pRStack_58;
  char *local_20;
  RepeatedField<int> *pRStack_18;
  
  iVar4 = this->current_size_;
  if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
    uVar9 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
  }
  else {
    pRVar5 = rep(this);
    uVar9 = pRVar5->allocated_size;
  }
  if ((int)uVar9 < iVar4) {
    psVar13 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                        ((long)iVar4,(long)(int)uVar9,"size() <= allocated_size()");
  }
  else {
    psVar13 = (string *)0x0;
  }
  if (psVar13 == (string *)0x0) {
    if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
      uVar9 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
    }
    else {
      pRVar5 = rep(this);
      uVar9 = pRVar5->allocated_size;
    }
    lVar10 = (long)this->capacity_proxy_ + 1;
    if ((int)lVar10 < (int)uVar9) {
      psVar13 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                          ((long)(int)uVar9,lVar10,"allocated_size() <= Capacity()");
    }
    else {
      psVar13 = (string *)0x0;
    }
    if (psVar13 == (string *)0x0) {
      return this->capacity_proxy_ < this->current_size_;
    }
  }
  else {
    SizeAtCapacity();
    psVar13 = extraout_RAX;
  }
  this_00 = (EpsCopyInputStream *)&stack0xffffffffffffffe0;
  SizeAtCapacity();
  sVar1 = *psVar13;
  uVar9 = (uint)(byte)sVar1;
  pRStack_58 = this;
  if ((char)sVar1 < '\0') {
    pVar15 = ReadSizeFallback((char *)psVar13,(uint)(byte)sVar1);
    psVar13 = (string *)pVar15.first;
    uVar9 = pVar15.second;
  }
  else {
    psVar13 = psVar13 + 1;
  }
  if (psVar13 == (string *)0x0) {
LAB_0026e341:
    unaff_R12 = (string *)0x0;
  }
  else {
    iVar4 = *(int *)&this_00->buffer_end_ - (int)psVar13;
    do {
      iVar11 = uVar9 - iVar4;
      if (iVar11 == 0 || (int)uVar9 < iVar4) {
        add_01.is_valid = (EnumValidityFuncWithArg *)pRStack_18;
        add_01.object = local_20;
        add_01.data = unaff_RBX;
        add_01.metadata = (InternalMetadata *)unaff_R14;
        add_01._32_8_ = unaff_retaddr;
        psVar7 = (string *)
                 ReadPackedVarintArray<google::protobuf::internal::PackedEnumParserArg<google::protobuf::UnknownFieldSet>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_>
                           ((char *)psVar13,(char *)(psVar13 + (int)uVar9),add_01);
        unaff_R12 = (string *)0x0;
        if (psVar13 + (int)uVar9 == psVar7) {
          unaff_R12 = psVar7;
        }
        break;
      }
      add.is_valid = (EnumValidityFuncWithArg *)pRStack_18;
      add.object = local_20;
      add.data = unaff_RBX;
      add.metadata = (InternalMetadata *)unaff_R14;
      add._32_8_ = unaff_retaddr;
      this_02 = pRStack_18;
      pcVar17 = unaff_RBX;
      uVar18 = unaff_R14;
      this_03 = unaff_retaddr;
      psVar13 = (string *)
                ReadPackedVarintArray<google::protobuf::internal::PackedEnumParserArg<google::protobuf::UnknownFieldSet>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_>
                          ((char *)psVar13,this_00->buffer_end_,add);
      if (psVar13 == (string *)0x0) goto LAB_0026e341;
      pcVar6 = this_00->buffer_end_;
      uVar12 = (int)psVar13 - (int)pcVar6;
      if (0x10 < uVar12) {
        EpsCopyInputStream::
        ReadPackedVarint<google::protobuf::internal::PackedEnumParserArg<google::protobuf::UnknownFieldSet>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_,google::protobuf::internal::EpsCopyInputStream::ReadPackedVarint<google::protobuf::internal::PackedEnumParserArg<google::protobuf::UnknownFieldSet>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_>(char_const*,google::protobuf::internal::PackedEnumParserArg<google::protobuf::UnknownFieldSet>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_)::_lambda(int)_1_>
                  ((EpsCopyInputStream *)&pcStack_80);
        psVar7 = extraout_RAX_00;
LAB_0026e39e:
        psVar13 = (string *)&pcStack_80;
        EpsCopyInputStream::
        ReadPackedVarint<google::protobuf::internal::PackedEnumParserArg<google::protobuf::UnknownFieldSet>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_,google::protobuf::internal::EpsCopyInputStream::ReadPackedVarint<google::protobuf::internal::PackedEnumParserArg<google::protobuf::UnknownFieldSet>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_>(char_const*,google::protobuf::internal::PackedEnumParserArg<google::protobuf::UnknownFieldSet>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_)::_lambda(int)_1_>
                  ();
        uVar8 = extraout_RDX;
        goto LAB_0026e3be;
      }
      if (iVar11 < 0x11) {
        uStack_70 = 0;
        uStack_6e = 0;
        pcStack_80 = *(char **)pcVar6;
        uStack_78 = (undefined2)*(undefined8 *)(pcVar6 + 8);
        uStack_76 = (undefined6)((ulong)*(undefined8 *)(pcVar6 + 8) >> 0x10);
        add_00.is_valid = (EnumValidityFuncWithArg *)pRStack_18;
        add_00.object = local_20;
        add_00.data = unaff_RBX;
        add_00.metadata = (InternalMetadata *)unaff_R14;
        add_00._32_8_ = unaff_retaddr;
        pcVar6 = ReadPackedVarintArray<google::protobuf::internal::PackedEnumParserArg<google::protobuf::UnknownFieldSet>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_>
                           ((char *)((long)&pcStack_80 + (ulong)(uVar12 & 0x1f)),
                            (char *)((long)&pcStack_80 + (long)iVar11),add_00);
        bVar2 = false;
        unaff_R12 = (string *)(this_00->buffer_end_ + ((long)pcVar6 - (long)&pcStack_80));
        if (pcVar6 != (char *)((long)&pcStack_80 + (long)iVar11)) {
          unaff_R12 = (string *)0x0;
        }
      }
      else {
        uVar9 = uVar9 - (iVar4 + uVar12);
        if ((int)uVar9 < 1) {
          psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                             ((long)(int)uVar9,0,"size > 0");
        }
        else {
          psVar7 = (string *)0x0;
        }
        if (psVar7 != (string *)0x0) goto LAB_0026e39e;
        if ((this_00->limit_ < 0x11) ||
           (psVar13 = (string *)EpsCopyInputStream::Next(this_00), psVar13 == (string *)0x0)) {
          bVar2 = false;
          unaff_R12 = (string *)0x0;
        }
        else {
          psVar13 = psVar13 + (uVar12 & 0x1f);
          iVar4 = *(int *)&this_00->buffer_end_ - (int)psVar13;
          bVar2 = true;
        }
      }
    } while (bVar2);
  }
  return SUB81(unaff_R12,0);
  while( true ) {
    cVar3 = (*pcVar17)(uVar18,uVar14 & 0xffffffff);
    if (cVar3 == '\0') {
      if ((this_03->ptr_ & 1U) == 0) {
        this_01 = InternalMetadata::mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                            (this_03);
      }
      else {
        this_01 = (UnknownFieldSet *)((this_03->ptr_ & 0xfffffffffffffffeU) + 8);
      }
      UnknownFieldSet::AddVarint(this_01,iVar4,(long)(int)uVar14);
      uVar8 = extraout_RDX_01;
    }
    else {
      RepeatedField<int>::Add(this_02,(int)uVar14);
      uVar8 = extraout_RDX_00;
    }
    if (psVar13 == (string *)0x0) break;
LAB_0026e3be:
    if (psVar7 <= psVar13) goto LAB_0026e442;
    uVar14 = (ulong)(char)*psVar13;
    if ((long)uVar14 < 0) {
      pVar16 = VarintParseSlow64((char *)psVar13,(uint)(byte)*psVar13);
      uVar14 = pVar16.second;
    }
    else {
      pVar16.second = uVar8;
      pVar16.first = (char *)(psVar13 + 1);
    }
    psVar13 = (string *)pVar16.first;
    if (psVar13 == (string *)0x0) break;
  }
  psVar13 = (string *)0x0;
LAB_0026e442:
  return SUB81(psVar13,0);
}

Assistant:

inline bool SizeAtCapacity() const {
    // Harden invariant size() <= allocated_size() <= Capacity().
    ABSL_DCHECK_LE(size(), allocated_size());
    ABSL_DCHECK_LE(allocated_size(), Capacity());
    // This is equivalent to `current_size_ == Capacity()`.
    // Assuming `Capacity()` function is inlined, compiler is likely to optimize
    // away "+ kSSOCapacity" and reduce it to "current_size_ > capacity_proxy_"
    // which is an instruction less than "current_size_ == capacity_proxy_ + 1".
    return current_size_ >= Capacity();
  }